

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

filtration_entry_t __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  bool bVar1;
  bool bVar2;
  coefficient_t cVar3;
  index_t iVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  long in_RDI;
  filtration_entry_t fVar6;
  coefficient_t coefficient;
  filtration_entry_t pivot;
  undefined6 in_stack_ffffffffffffff38;
  coefficient_t in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff40;
  index_t in_stack_ffffffffffffff44;
  coefficient_t in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff72;
  undefined4 in_stack_ffffffffffffff74;
  coefficient_t in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined4 in_stack_ffffffffffffff94;
  undefined2 local_3a;
  undefined8 local_c;
  undefined2 local_4;
  
  remove_trivial_coefficient_entries
            ((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              *)CONCAT44(in_stack_ffffffffffffff94,
                         CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
  bVar1 = std::
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ::empty((priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   *)0x1d069b);
  if (bVar1) {
    local_c._0_4_ = dummy.super_pair<float,_entry_t>.first;
    local_c._4_4_ = dummy.super_pair<float,_entry_t>.second.index;
    local_4 = dummy.super_pair<float,_entry_t>.second.coefficient;
    uVar5 = extraout_RDX;
  }
  else {
    fVar6 = get_top((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                     *)CONCAT44(in_stack_ffffffffffffff74,
                                CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)));
    local_c = fVar6.super_pair<float,_entry_t>._0_8_;
    local_4 = fVar6.super_pair<float,_entry_t>.second.coefficient;
    local_3a = 0;
    do {
      get_top((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               *)CONCAT44(in_stack_ffffffffffffff74,
                          CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)));
      cVar3 = get_coefficient((filtration_entry_t *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_3a = (short)(((int)local_3a + (int)cVar3) % (int)*(short *)(in_RDI + 0x92));
      safe_pop((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                *)CONCAT44(in_stack_ffffffffffffff74,
                           CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)));
      remove_trivial_coefficient_entries
                ((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                  *)CONCAT44(in_stack_ffffffffffffff94,
                             CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
      if (local_3a == 0) {
        bVar1 = std::
                priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                ::empty((priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                         *)0x1d0795);
        if (bVar1) {
          local_c._0_4_ = dummy.super_pair<float,_entry_t>.first;
          local_c._4_4_ = dummy.super_pair<float,_entry_t>.second.index;
          local_4 = dummy.super_pair<float,_entry_t>.second.coefficient;
          uVar5 = extraout_RDX_00;
          goto LAB_001d08b0;
        }
        fVar6 = get_top((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                         *)CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)));
        in_stack_ffffffffffffff90 = fVar6.super_pair<float,_entry_t>.second.coefficient;
        filtration_entry_t::operator=
                  ((filtration_entry_t *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (filtration_entry_t *)
                   CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
      }
      bVar2 = std::
              priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::empty((priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                       *)0x1d0802);
      bVar1 = false;
      if (!bVar2) {
        fVar6 = get_top((priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                         *)CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)));
        in_stack_ffffffffffffff70 = fVar6.super_pair<float,_entry_t>.second.coefficient;
        in_stack_ffffffffffffff44 =
             get_index((filtration_entry_t *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        iVar4 = get_index((filtration_entry_t *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        bVar1 = in_stack_ffffffffffffff44 == iVar4;
      }
    } while (bVar1);
    iVar4 = get_index((filtration_entry_t *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    uVar5 = extraout_RDX_01;
    if (iVar4 != -1) {
      set_coefficient((filtration_entry_t *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff3e);
      uVar5 = extraout_RDX_02;
    }
  }
LAB_001d08b0:
  fVar6.super_pair<float,_entry_t>.second._4_4_ =
       (undefined4)CONCAT62((int6)((ulong)uVar5 >> 0x10),local_4);
  fVar6.super_pair<float,_entry_t>.first = (float)local_c;
  fVar6.super_pair<float,_entry_t>.second.index = local_c._4_4_;
  return (filtration_entry_t)fVar6.super_pair<float,_entry_t>;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return dummy;
		else {
			auto pivot = get_top();

#ifdef USE_COEFFICIENTS
			coefficient_t coefficient = 0;
			do {
				coefficient = (coefficient + get_coefficient(get_top())) % modulus;
				safe_pop();
				remove_trivial_coefficient_entries();

				if (coefficient == 0) {
					if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
						return dummy;
					else
						pivot = get_top();
				}
			} while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			         get_index(get_top()) == get_index(pivot));
			if (get_index(pivot) != -1) { set_coefficient(pivot, coefficient); }
#else
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return dummy;
				else {
					pivot = get_top();
					safe_pop();
				}
			}
#endif
			return pivot;
		}
	}